

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hu_scores.cpp
# Opt level: O0

void HU_DrawColorBar(int x,int y,int height,int playernum)

{
  DFrameBuffer *pDVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  uint uVar5;
  int iVar6;
  int iVar7;
  uint uVar8;
  float local_30;
  float local_2c;
  float b;
  float g;
  float r;
  float v;
  float s;
  float h;
  int playernum_local;
  int height_local;
  int y_local;
  int x_local;
  
  s = (float)playernum;
  h = (float)height;
  playernum_local = y;
  height_local = x;
  D_GetPlayerColor(playernum,&v,&r,&g,(FPlayerColorSet **)0x0);
  HSVtoRGB(&b,&local_2c,&local_30,v,r,g);
  iVar3 = height_local;
  iVar2 = playernum_local;
  pDVar1 = screen;
  uVar4 = height_local + CleanXfac * 0x18;
  uVar5 = playernum_local + (int)h;
  iVar6 = clamp<int>((int)(b * 255.0),0,0xff);
  iVar7 = clamp<int>((int)(local_2c * 255.0),0,0xff);
  uVar8 = clamp<int>((int)(local_30 * 255.0),0,0xff);
  (*(pDVar1->super_DSimpleCanvas).super_DCanvas.super_DObject._vptr_DObject[0x13])
            (pDVar1,(ulong)(uint)iVar3,(ulong)(uint)iVar2,(ulong)uVar4,(ulong)uVar5,0xffffffff,
             iVar6 << 0x10 | 0xff000000U | iVar7 << 8 | uVar8);
  return;
}

Assistant:

void HU_DrawColorBar(int x, int y, int height, int playernum)
{
	float h, s, v, r, g, b;

	D_GetPlayerColor (playernum, &h, &s, &v, NULL);
	HSVtoRGB (&r, &g, &b, h, s, v);

	screen->Clear (x, y, x + 24*CleanXfac, y + height, -1,
		MAKEARGB(255,clamp(int(r*255.f),0,255),
					 clamp(int(g*255.f),0,255),
					 clamp(int(b*255.f),0,255)));
}